

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O0

gdImagePtr gdImageCreateFromGifCtx(gdIOCtxPtr fd)

{
  int iVar1;
  uint sx;
  uint sy;
  bool bVar2;
  int height;
  int width;
  int left;
  int top;
  gdImagePtr im;
  int local_668;
  int haveGlobalColormap;
  int ZeroDataBlock;
  int i;
  int bitPixel;
  int useGlobalColormap;
  int screen_height;
  int screen_width;
  int imh;
  int imw;
  uchar localColorMap [3] [256];
  uchar ColorMap [3] [256];
  byte local_39;
  ushort local_38;
  undefined2 local_36;
  ushort local_34;
  ushort local_32;
  uchar c;
  uchar buf [16];
  int local_20;
  int local_1c;
  int Transparent;
  int BitPixel;
  gdIOCtxPtr fd_local;
  
  local_20 = -1;
  local_668 = 0;
  _left = (gdImagePtr)0x0;
  _Transparent = fd;
  iVar1 = gdGetBuf(&local_38,6,fd);
  if (iVar1 < 1) {
    fd_local = (gdIOCtxPtr)0x0;
  }
  else {
    iVar1 = strncmp((char *)&local_38,"GIF",3);
    if (iVar1 == 0) {
      iVar1 = memcmp((void *)((long)&local_36 + 1),"87a",3);
      if ((iVar1 == 0) || (iVar1 = memcmp((void *)((long)&local_36 + 1),"89a",3), iVar1 == 0)) {
        iVar1 = gdGetBuf(&local_38,7,_Transparent);
        if (iVar1 < 1) {
          fd_local = (gdIOCtxPtr)0x0;
        }
        else {
          local_1c = 2 << ((byte)local_34 & 7);
          useGlobalColormap = (int)local_38;
          bitPixel = (int)local_36;
          bVar2 = ((byte)local_34 & 0x80) != 0x80;
          screen_height = bitPixel;
          screen_width = useGlobalColormap;
          if ((bVar2) ||
             (iVar1 = ReadColorMap(_Transparent,local_1c,(uchar (*) [256])(localColorMap[2] + 0xf8))
             , iVar1 == 0)) {
            do {
              while( true ) {
                iVar1 = gdGetBuf(&local_39,1,_Transparent);
                if (iVar1 < 1) {
                  return (gdImagePtr)0x0;
                }
                if (local_39 == 0x3b) goto LAB_0011d95f;
                if (local_39 != 0x21) break;
                iVar1 = gdGetBuf(&local_39,1,_Transparent);
                if (iVar1 < 1) {
                  return (gdImagePtr)0x0;
                }
                DoExtension(_Transparent,(uint)local_39,&local_20,&local_668);
              }
            } while (local_39 != 0x2c);
            iVar1 = gdGetBuf(&local_38,9,_Transparent);
            if (iVar1 < 1) {
              fd_local = (gdIOCtxPtr)0x0;
            }
            else {
              i = (int)(((buf[0] & 0x80) == 0x80 ^ 0xffU) & 1);
              ZeroDataBlock = 1 << (buf[0] & 7) + 1;
              sx = (uint)local_34;
              sy = (uint)local_32;
              if ((useGlobalColormap < (int)(local_38 + sx)) || (bitPixel < (int)(local_36 + sy))) {
                fd_local = (gdIOCtxPtr)0x0;
              }
              else {
                _left = gdImageCreate(sx,sy);
                if (_left == (gdImagePtr)0x0) {
                  fd_local = (gdIOCtxPtr)0x0;
                }
                else {
                  _left->interlace = (uint)((buf[0] & 0x40) == 0x40);
                  if (i == 0) {
                    iVar1 = ReadColorMap(_Transparent,ZeroDataBlock,(uchar (*) [256])&imh);
                    if (iVar1 != 0) {
                      gdImageDestroy(_left);
                      return (gdImagePtr)0x0;
                    }
                    ReadImage(_left,_Transparent,sx,sy,(uchar (*) [256])&imh,
                              (uint)((buf[0] & 0x40) == 0x40),&local_668);
                  }
                  else {
                    if (bVar2) {
                      gdImageDestroy(_left);
                      return (gdImagePtr)0x0;
                    }
                    ReadImage(_left,_Transparent,sx,sy,(uchar (*) [256])(localColorMap[2] + 0xf8),
                              (uint)((buf[0] & 0x40) == 0x40),&local_668);
                  }
                  if (local_20 != -1) {
                    gdImageColorTransparent(_left,local_20);
                  }
LAB_0011d95f:
                  if (_left == (gdImagePtr)0x0) {
                    fd_local = (gdIOCtxPtr)0x0;
                  }
                  else if (_left->colorsTotal == 0) {
                    gdImageDestroy(_left);
                    fd_local = (gdIOCtxPtr)0x0;
                  }
                  else {
                    haveGlobalColormap = _left->colorsTotal;
                    while ((haveGlobalColormap = haveGlobalColormap + -1, -1 < haveGlobalColormap &&
                           (_left->open[haveGlobalColormap] != 0))) {
                      _left->colorsTotal = _left->colorsTotal + -1;
                    }
                    fd_local = (gdIOCtxPtr)_left;
                  }
                }
              }
            }
          }
          else {
            fd_local = (gdIOCtxPtr)0x0;
          }
        }
      }
      else {
        fd_local = (gdIOCtxPtr)0x0;
      }
    }
    else {
      fd_local = (gdIOCtxPtr)0x0;
    }
  }
  return (gdImagePtr)fd_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGifCtx(gdIOCtxPtr fd)
{
	int BitPixel;
#if 0
	int ColorResolution;
	int Background;
	int AspectRatio;
#endif
	int Transparent = (-1);
	unsigned char buf[16];
	unsigned char c;
	unsigned char ColorMap[3][MAXCOLORMAPSIZE];
	unsigned char localColorMap[3][MAXCOLORMAPSIZE];
	int imw, imh, screen_width, screen_height;
	int useGlobalColormap;
	int bitPixel, i;
	/*1.4//int             imageCount = 0; */
	/* 2.0.28: threadsafe storage */
	int ZeroDataBlock = FALSE;
	int haveGlobalColormap;

	gdImagePtr im = 0;

	if(!ReadOK(fd, buf, 6)) {
		return 0;
	}

	if(strncmp((char *)buf, "GIF", 3) != 0) {
		return 0;
	}

	if(memcmp((char *)buf + 3, "87a", 3) == 0) {
		/* GIF87a */
	} else if(memcmp((char *)buf + 3, "89a", 3) == 0) {
		/* GIF89a */
	} else {
		return 0;
	}

	if(!ReadOK(fd, buf, 7)) {
		return 0;
	}

	BitPixel = 2 << (buf[4] & 0x07);
#if 0
	ColorResolution = (int) (((buf[4]&0x70)>>3)+1);
	Background = buf[5];
	AspectRatio = buf[6];
#endif
	screen_width = imw = LM_to_uint(buf[0], buf[1]);
	screen_height = imh = LM_to_uint(buf[2], buf[3]);

	haveGlobalColormap = BitSet(buf[4], LOCALCOLORMAP); /* Global Colormap */
	if(haveGlobalColormap) {
		if(ReadColorMap(fd, BitPixel, ColorMap)) {
			return 0;
		}
	}

	for (;;) {
		int top, left;
		int width, height;

		if(!ReadOK(fd, &c, 1)) {
			return 0;
		}

		if (c == ';') { /* GIF terminator */
			goto terminated;
		}

		if(c == '!') { /* Extension */
			if(!ReadOK(fd, &c, 1)) {
				return 0;
			}

			DoExtension(fd, c, &Transparent, &ZeroDataBlock);
			continue;
		}

		if(c != ',') { /* Not a valid start character */
			continue;
		}

		/*1.4//++imageCount; */

		if(!ReadOK(fd, buf, 9)) {
			return 0;
		}

		useGlobalColormap = !BitSet(buf[8], LOCALCOLORMAP);

		bitPixel = 1 << ((buf[8] & 0x07) + 1);
		left = LM_to_uint(buf[0], buf[1]);
		top = LM_to_uint(buf[2], buf[3]);
		width = LM_to_uint(buf[4], buf[5]);
		height = LM_to_uint(buf[6], buf[7]);

		if(((left + width) > screen_width) || ((top + height) > screen_height)) {
			if(VERBOSE) {
				printf("Frame is not confined to screen dimension.\n");
			}
			return 0;
		}

		if(!(im = gdImageCreate(width, height))) {
			return 0;
		}

		im->interlace = BitSet(buf[8], INTERLACE);
		if(!useGlobalColormap) {
			if(ReadColorMap(fd, bitPixel, localColorMap)) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, localColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		} else {
			if(!haveGlobalColormap) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, ColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		}

		if(Transparent != (-1)) {
			gdImageColorTransparent(im, Transparent);
		}

		goto terminated;
	}

terminated:
	/* Terminator before any image was declared! */
	if(!im) {
		return 0;
	}

	if(!im->colorsTotal) {
		gdImageDestroy(im);
		return 0;
	}

	/* Check for open colors at the end, so
	 * we can reduce colorsTotal and ultimately
	 * BitsPerPixel */
	for(i = im->colorsTotal - 1; i >= 0; i--) {
		if(im->open[i]) {
			im->colorsTotal--;
		} else {
			break;
		}
	}

	return im;
}